

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
double_writer::operator()
          (double_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  long lVar1;
  ulong uVar2;
  char *__value;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_30;
  
  if (this[8] != (double_writer)0x0) {
    local_30._M_stream = (ostream_type *)CONCAT71(local_30._M_stream._1_7_,this[8]);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(it,(char *)&local_30);
    *(long *)this = *(long *)this + -1;
  }
  __value = *(char **)(*(long *)(this + 0x10) + 8);
  lVar1 = *(long *)(*(long *)(this + 0x10) + 0x10);
  local_30._M_stream = it->_M_stream;
  local_30._M_string = it->_M_string;
  if (0 < lVar1) {
    uVar2 = lVar1 + 1;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_30,__value);
      __value = __value + 1;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  it->_M_stream = local_30._M_stream;
  it->_M_string = local_30._M_string;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }